

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * instruct_move(Proc *proc,opcode op,Pseudo *target,Pseudo *src,uint line_number)

{
  Instruction *insn;
  Pseudo *pseudo;
  Pseudo *tofree;
  Instruction *mov;
  uint line_number_local;
  Pseudo *src_local;
  Pseudo *target_local;
  opcode op_local;
  Proc *proc_local;
  
  insn = allocate_instruction(proc,op,line_number);
  pseudo = add_instruction_operand(proc,insn,src);
  add_instruction_target(proc,insn,target);
  add_instruction(proc,insn);
  if (pseudo != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo,false);
  }
  return target;
}

Assistant:

static Pseudo *instruct_move(Proc *proc, enum opcode op, Pseudo *target, Pseudo *src, unsigned line_number)
{
	Instruction *mov = allocate_instruction(proc, op, line_number);
	Pseudo *tofree = add_instruction_operand(proc, mov, src);
	add_instruction_target(proc, mov, target);
	add_instruction(proc, mov);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return target;
}